

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O2

cbtCollisionShape * __thiscall
cbtCollisionWorldImporter::createCylinderShapeY
          (cbtCollisionWorldImporter *this,cbtScalar radius,cbtScalar height)

{
  cbtCollisionShape *this_00;
  undefined8 local_20;
  cbtScalar local_18;
  cbtScalar local_14;
  
  this_00 = (cbtCollisionShape *)cbtCylinderShape::operator_new(0x48);
  local_20 = (cbtCollisionShape *)CONCAT44(height,radius);
  local_14 = 0.0;
  local_18 = radius;
  cbtCylinderShape::cbtCylinderShape((cbtCylinderShape *)this_00,(cbtVector3 *)&local_20);
  local_20 = this_00;
  cbtAlignedObjectArray<cbtCollisionShape_*>::push_back
            (&this->m_allocatedCollisionShapes,(cbtCollisionShape **)&local_20);
  return this_00;
}

Assistant:

cbtCollisionShape* cbtCollisionWorldImporter::createCylinderShapeY(cbtScalar radius, cbtScalar height)
{
	cbtCylinderShape* shape = new cbtCylinderShape(cbtVector3(radius, height, radius));
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}